

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O1

void Dau_VerifyFile(char *pFileName)

{
  FILE *__stream;
  char *pcVar1;
  size_t sVar2;
  word wVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uTruth2;
  char Buffer [1000];
  undefined4 local_41c;
  char local_418 [11];
  char local_40d [989];
  
  __stream = fopen(pFileName,"rb");
  pcVar1 = fgets(local_418,1000,__stream);
  if (pcVar1 == (char *)0x0) {
    uVar5 = 0;
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    uVar6 = 0;
    do {
      sVar2 = strlen(local_418);
      if (local_418[sVar2 - 1] == '\n') {
        local_418[sVar2 - 1] = '\0';
      }
      sVar2 = strlen(local_418);
      if (local_418[sVar2 - 1] == '\r') {
        local_418[sVar2 - 1] = '\0';
      }
      Extra_ReadHexadecimal(&local_41c,local_418,5);
      sVar2 = strlen(local_40d);
      wVar3 = Dau_ParseFormula_rec(local_40d,local_40d + sVar2);
      if (local_41c != (uint)wVar3) {
        printf("Verification failed in line %d:  %s\n",uVar6,local_418);
        uVar4 = uVar4 + 1;
      }
      uVar5 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar5;
      pcVar1 = fgets(local_418,1000,__stream);
    } while (pcVar1 != (char *)0x0);
  }
  printf("Verification succeeded for %d functions and failed for %d functions.\n",
         (ulong)(uVar5 - uVar4),(ulong)uVar4);
  return;
}

Assistant:

void Dau_VerifyFile( char * pFileName )
{
    char Buffer[1000];
    unsigned uTruth, uTruth2; 
    int nFails = 0, nLines = 0;
    FILE * pFile = fopen( pFileName, "rb" );
    while ( fgets( Buffer, 1000, pFile ) )
    {
        if ( Buffer[strlen(Buffer)-1] == '\n' )
            Buffer[strlen(Buffer)-1] = 0;
        if ( Buffer[strlen(Buffer)-1] == '\r' )
            Buffer[strlen(Buffer)-1] = 0;
        Extra_ReadHexadecimal( &uTruth2, Buffer, 5 );
        uTruth = (unsigned)Dau_ParseFormula( Buffer + 11 );
        if ( uTruth != uTruth2 )
            printf( "Verification failed in line %d:  %s\n", nLines, Buffer ), nFails++;
        nLines++;
    }
    printf( "Verification succeeded for %d functions and failed for %d functions.\n", nLines-nFails, nFails );
}